

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RtreeNode * rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur,int *pRC)

{
  RtreeNode *pRVar1;
  RtreeSearchPoint *pRVar2;
  int iVar3;
  long lVar4;
  RtreeNode **ppNode;
  
  lVar4 = 1 - (ulong)pCur->bPoint;
  pRVar1 = *(RtreeNode **)((long)pCur + lVar4 * 8 + 0x58);
  if (pRVar1 != (RtreeNode *)0x0) {
    return pRVar1;
  }
  ppNode = (RtreeNode **)((long)pCur + lVar4 * 8 + 0x58);
  if (pCur->bPoint == 1) {
    pRVar2 = &pCur->sPoint;
  }
  else {
    pRVar2 = pCur->aPoint;
  }
  iVar3 = nodeAcquire((Rtree *)(pCur->base).pVtab,pRVar2->id,(RtreeNode *)0x0,ppNode);
  *pRC = iVar3;
  return *ppNode;
}

Assistant:

static RtreeNode *rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur, int *pRC){
  sqlite3_int64 id;
  int ii = 1 - pCur->bPoint;
  assert( ii==0 || ii==1 );
  assert( pCur->bPoint || pCur->nPoint );
  if( pCur->aNode[ii]==0 ){
    assert( pRC!=0 );
    id = ii ? pCur->aPoint[0].id : pCur->sPoint.id;
    *pRC = nodeAcquire(RTREE_OF_CURSOR(pCur), id, 0, &pCur->aNode[ii]);
  }
  return pCur->aNode[ii];
}